

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::str_writer<char>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
           *this,align_spec *spec,str_writer<char> *f)

{
  ulong uVar1;
  iterator iVar2;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar3;
  ulong uVar4;
  char *__last;
  char *__first;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  wchar_t __tmp;
  wchar_t local_48;
  wchar_t local_44;
  ulong local_40;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
  *local_38;
  
  uVar4 = (ulong)spec->width_;
  uVar1 = f->size_;
  uVar5 = uVar1 - uVar4;
  if (uVar1 < uVar4) {
    local_48 = spec->fill_;
    uVar6 = uVar4 - uVar1;
    if (spec->align_ == ALIGN_CENTER) {
      uVar5 = uVar6 >> 1;
      bVar3.container = *(vector<wchar_t,_std::allocator<wchar_t>_> **)this;
      local_44 = local_48;
      local_40 = uVar5;
      local_38 = this;
      if (1 < uVar6) {
        do {
          iVar2._M_current =
               ((bVar3.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              ((bVar3.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                      ((vector<wchar_t,std::allocator<wchar_t>> *)bVar3.container,iVar2,&local_48);
          }
          else {
            *iVar2._M_current = local_48;
            ((bVar3.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      this = local_38;
      *(vector<wchar_t,_std::allocator<wchar_t>_> **)local_38 = bVar3.container;
      bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                        (f->s,f->s + f->size_,bVar3);
      *(vector<wchar_t,_std::allocator<wchar_t>_> **)this = bVar3.container;
      local_48 = local_44;
      if (uVar6 != local_40) {
        lVar7 = (uVar1 + local_40) - uVar4;
        do {
          iVar2._M_current =
               ((bVar3.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              ((bVar3.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                      ((vector<wchar_t,std::allocator<wchar_t>> *)bVar3.container,iVar2,&local_48);
          }
          else {
            *iVar2._M_current = local_48;
            ((bVar3.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0);
      }
      goto LAB_0018c497;
    }
    if (spec->align_ != ALIGN_RIGHT) {
      bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                        (f->s,f->s + uVar1,*(vector<wchar_t,_std::allocator<wchar_t>_> **)this);
      *(vector<wchar_t,_std::allocator<wchar_t>_> **)this = bVar3.container;
      while (uVar6 != 0) {
        iVar2._M_current =
             ((bVar3.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            ((bVar3.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                    ((vector<wchar_t,std::allocator<wchar_t>> *)bVar3.container,iVar2,&local_48);
        }
        else {
          *iVar2._M_current = local_48;
          ((bVar3.container)->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        uVar5 = uVar5 + 1;
        uVar6 = uVar5;
      }
      goto LAB_0018c497;
    }
    bVar3.container = *(vector<wchar_t,_std::allocator<wchar_t>_> **)this;
    if (uVar6 != 0) {
      lVar7 = uVar1 - uVar4;
      do {
        iVar2._M_current = *(wchar_t **)((long)bVar3.container + 8);
        if (iVar2._M_current == *(wchar_t **)((long)bVar3.container + 0x10)) {
          std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                    ((vector<wchar_t,std::allocator<wchar_t>> *)bVar3.container,iVar2,&local_48);
        }
        else {
          *iVar2._M_current = local_48;
          *(wchar_t **)((long)bVar3.container + 8) = iVar2._M_current + 1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0);
    }
    *(vector<wchar_t,_std::allocator<wchar_t>_> **)this = bVar3.container;
    __first = f->s;
    __last = __first + f->size_;
  }
  else {
    __first = f->s;
    __last = __first + uVar1;
    bVar3.container = *(vector<wchar_t,_std::allocator<wchar_t>_> **)this;
  }
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                    (__first,__last,bVar3);
LAB_0018c497:
  *(vector<wchar_t,_std::allocator<wchar_t>_> **)this = bVar3.container;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }